

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::CFGBuilder::follow_function_call(CFGBuilder *this,SPIRFunction *func)

{
  bool bVar1;
  mapped_type *this_00;
  CFG *this_01;
  uint32_t local_3c;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
  local_38;
  uint32_t local_2c;
  _Node_iterator_base<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>,_false>
  local_28;
  SPIRFunction *local_20;
  SPIRFunction *func_local;
  CFGBuilder *this_local;
  
  local_20 = func;
  func_local = (SPIRFunction *)this;
  local_2c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(func->super_IVariant).self);
  local_28._M_cur =
       (__node_type *)
       ::std::
       unordered_map<unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>_>
       ::find(&this->function_cfgs,&local_2c);
  local_38._M_cur =
       (__node_type *)
       ::std::
       end<std::unordered_map<unsigned_int,std::unique_ptr<spirv_cross::CFG,std::default_delete<spirv_cross::CFG>>,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::unique_ptr<spirv_cross::CFG,std::default_delete<spirv_cross::CFG>>>>>>
                 (&this->function_cfgs);
  bVar1 = ::std::__detail::operator==(&local_28,&local_38);
  if (bVar1) {
    local_3c = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_20->super_IVariant).self);
    this_00 = ::std::
              unordered_map<unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>_>_>_>
              ::operator[](&this->function_cfgs,&local_3c);
    this_01 = (CFG *)operator_new(0x168);
    CFG::CFG(this_01,this->compiler,local_20);
    ::std::unique_ptr<spirv_cross::CFG,_std::default_delete<spirv_cross::CFG>_>::reset
              (this_00,this_01);
  }
  return bVar1;
}

Assistant:

bool Compiler::CFGBuilder::follow_function_call(const SPIRFunction &func)
{
	if (function_cfgs.find(func.self) == end(function_cfgs))
	{
		function_cfgs[func.self].reset(new CFG(compiler, func));
		return true;
	}
	else
		return false;
}